

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

uint64_t __thiscall
leveldb::VersionSet::ApproximateOffsetOf(VersionSet *this,Version *v,InternalKey *ikey)

{
  TableCache *this_00;
  Iterator *this_01;
  Table *pTVar1;
  int iVar2;
  Table *pTVar3;
  const_reference ppFVar4;
  uint64_t uVar5;
  Slice local_70;
  ReadOptions local_60;
  Iterator *local_50;
  Iterator *iter;
  Table *tableptr;
  size_t i;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  uint64_t uStack_28;
  int level;
  uint64_t result;
  InternalKey *ikey_local;
  Version *v_local;
  VersionSet *this_local;
  
  uStack_28 = 0;
  files._4_4_ = 0;
  result = (uint64_t)ikey;
  ikey_local = (InternalKey *)v;
  v_local = (Version *)this;
  do {
    if (6 < files._4_4_) {
      return uStack_28;
    }
    i = (size_t)(&ikey_local[1].rep_ + (long)files._4_4_ * 0x18);
    for (tableptr = (Table *)0x0; pTVar1 = tableptr,
        pTVar3 = (Table *)std::
                          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          ::size((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                  *)i), pTVar1 < pTVar3;
        tableptr = (Table *)((long)&tableptr->rep_ + 1)) {
      ppFVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)i,(size_type)tableptr);
      iVar2 = InternalKeyComparator::Compare
                        (&this->icmp_,&(*ppFVar4)->largest,(InternalKey *)result);
      if (iVar2 < 1) {
        ppFVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              *)i,(size_type)tableptr);
        uStack_28 = (*ppFVar4)->file_size + uStack_28;
      }
      else {
        ppFVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              *)i,(size_type)tableptr);
        iVar2 = InternalKeyComparator::Compare
                          (&this->icmp_,&(*ppFVar4)->smallest,(InternalKey *)result);
        if (iVar2 < 1) {
          this_00 = this->table_cache_;
          memset(&local_60,0,0x10);
          ReadOptions::ReadOptions(&local_60);
          ppFVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                    operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                *)i,(size_type)tableptr);
          uVar5 = (*ppFVar4)->number;
          ppFVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                    operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                *)i,(size_type)tableptr);
          local_50 = TableCache::NewIterator
                               (this_00,&local_60,uVar5,(*ppFVar4)->file_size,(Table **)&iter);
          this_01 = iter;
          if (iter != (Iterator *)0x0) {
            local_70 = InternalKey::Encode((InternalKey *)result);
            uVar5 = Table::ApproximateOffsetOf((Table *)this_01,&local_70);
            uStack_28 = uVar5 + uStack_28;
          }
          if (local_50 != (Iterator *)0x0) {
            (*local_50->_vptr_Iterator[1])();
          }
        }
        else if (0 < files._4_4_) break;
      }
    }
    files._4_4_ = files._4_4_ + 1;
  } while( true );
}

Assistant:

uint64_t VersionSet::ApproximateOffsetOf(Version* v, const InternalKey& ikey) {
  uint64_t result = 0;
  for (int level = 0; level < config::kNumLevels; level++) {
    const std::vector<FileMetaData*>& files = v->files_[level];
    for (size_t i = 0; i < files.size(); i++) {
      if (icmp_.Compare(files[i]->largest, ikey) <= 0) {
        // Entire file is before "ikey", so just add the file size
        result += files[i]->file_size;
      } else if (icmp_.Compare(files[i]->smallest, ikey) > 0) {
        // Entire file is after "ikey", so ignore
        if (level > 0) {
          // Files other than level 0 are sorted by meta->smallest, so
          // no further files in this level will contain data for
          // "ikey".
          break;
        }
      } else {
        // "ikey" falls in the range for this table.  Add the
        // approximate offset of "ikey" within the table.
        Table* tableptr;
        Iterator* iter = table_cache_->NewIterator(
            ReadOptions(), files[i]->number, files[i]->file_size, &tableptr);
        if (tableptr != nullptr) {
          result += tableptr->ApproximateOffsetOf(ikey.Encode());
        }
        delete iter;
      }
    }
  }
  return result;
}